

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

aiScene * __thiscall Assimp::Importer::ApplyPostProcessing(Importer *this,uint pFlags)

{
  uint *puVar1;
  pointer ppBVar2;
  BaseProcess *this_00;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_> uVar3;
  bool bVar4;
  int iVar5;
  Logger *pLVar6;
  ImporterPimpl *pIVar7;
  aiScene *paVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  allocator<char> local_59;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  profiler;
  ValidateDSProcess ds;
  
  if (this->pimpl == (ImporterPimpl *)0x0) {
    __assert_fail("nullptr != pimpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                  ,0x2e0,"const aiScene *Assimp::Importer::ApplyPostProcessing(unsigned int)");
  }
  paVar8 = this->pimpl->mScene;
  if (paVar8 == (aiScene *)0x0) {
LAB_0030ee79:
    paVar8 = (aiScene *)0x0;
  }
  else {
    if (pFlags == 0) {
      return paVar8;
    }
    bVar4 = _ValidateFlags(pFlags);
    if (!bVar4) {
      __assert_fail("_ValidateFlags(pFlags)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                    ,0x2ee,"const aiScene *Assimp::Importer::ApplyPostProcessing(unsigned int)");
    }
    pLVar6 = DefaultLogger::get();
    Logger::info(pLVar6,"Entering post processing pipeline");
    if ((pFlags >> 10 & 1) != 0) {
      ValidateDSProcess::ValidateDSProcess(&ds);
      BaseProcess::ExecuteOnScene(&ds.super_BaseProcess,this);
      paVar8 = this->pimpl->mScene;
      ValidateDSProcess::~ValidateDSProcess(&ds);
      if (paVar8 == (aiScene *)0x0) goto LAB_0030ee79;
    }
    uVar9 = (ulong)(pFlags | 0x400);
    if (this->pimpl->bExtraVerbose == false) {
      uVar9 = (ulong)pFlags;
    }
    iVar5 = GetPropertyInteger(this,"GLOB_MEASURE_TIME",0);
    uVar10 = 0;
    if (iVar5 == 0) {
      profiler._M_t.
      super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
           (__uniq_ptr_data<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>,_true,_true>
            )(__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
              )0x0;
    }
    else {
      profiler._M_t.
      super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
           (__uniq_ptr_data<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>,_true,_true>
            )operator_new(0x30);
      *(undefined4 *)
       ((long)profiler._M_t.
              super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
              ._M_t.
              super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
              .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 8) = 0;
      *(undefined8 *)
       ((long)profiler._M_t.
              super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
              ._M_t.
              super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
              .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 0x10) = 0;
      *(long *)((long)profiler._M_t.
                      super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl +
               0x18) =
           (long)profiler._M_t.
                 super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                 .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 8;
      *(long *)((long)profiler._M_t.
                      super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl +
               0x20) =
           (long)profiler._M_t.
                 super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                 .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 8;
      *(undefined8 *)
       ((long)profiler._M_t.
              super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
              ._M_t.
              super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
              .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 0x28) = 0;
    }
    while( true ) {
      uVar11 = (ulong)uVar10;
      pIVar7 = this->pimpl;
      ppBVar2 = (pIVar7->mPostProcessingSteps).
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pIVar7->mPostProcessingSteps).
                        super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar2 >> 3) <= uVar11)
      break;
      this_00 = ppBVar2[uVar11];
      (*pIVar7->mProgressHandler->_vptr_ProgressHandler[4])(pIVar7->mProgressHandler,uVar11);
      iVar5 = (*this_00->_vptr_BaseProcess[2])(this_00,uVar9);
      uVar3 = profiler;
      if ((char)iVar5 != '\0') {
        if ((__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
             )profiler._M_t.
              super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
              ._M_t.
              super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
              .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
             )0x0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&ds,"postprocess",&local_59);
          Profiling::Profiler::BeginRegion
                    ((Profiler *)
                     uVar3._M_t.
                     super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                     .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
                     (string *)&ds);
          std::__cxx11::string::~string((string *)&ds);
        }
        BaseProcess::ExecuteOnScene(this_00,this);
        uVar3 = profiler;
        if ((__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
             )profiler._M_t.
              super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
              ._M_t.
              super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
              .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
             )0x0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&ds,"postprocess",&local_59);
          Profiling::Profiler::EndRegion
                    ((Profiler *)
                     uVar3._M_t.
                     super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                     .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
                     (string *)&ds);
          std::__cxx11::string::~string((string *)&ds);
        }
      }
      pIVar7 = this->pimpl;
      if (pIVar7->mScene == (aiScene *)0x0) break;
      if (pIVar7->bExtraVerbose == true) {
        pLVar6 = DefaultLogger::get();
        Logger::debug(pLVar6,"Verbose Import: re-validating data structures");
        ValidateDSProcess::ValidateDSProcess(&ds);
        BaseProcess::ExecuteOnScene((BaseProcess *)&ds,this);
        if (this->pimpl->mScene == (aiScene *)0x0) {
          pLVar6 = DefaultLogger::get();
          Logger::error(pLVar6,"Verbose Import: failed to re-validate data structures");
          ValidateDSProcess::~ValidateDSProcess(&ds);
          pIVar7 = this->pimpl;
          break;
        }
        ValidateDSProcess::~ValidateDSProcess(&ds);
      }
      uVar10 = uVar10 + 1;
    }
    (*pIVar7->mProgressHandler->_vptr_ProgressHandler[4])
              (pIVar7->mProgressHandler,
               (ulong)((long)(pIVar7->mPostProcessingSteps).
                             super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pIVar7->mPostProcessingSteps).
                            super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
    pIVar7 = this->pimpl;
    if (pIVar7->mScene != (aiScene *)0x0) {
      puVar1 = (uint *)((long)pIVar7->mScene->mPrivate + 8);
      *puVar1 = *puVar1 | (uint)uVar9;
      pIVar7 = this->pimpl;
    }
    SharedPostProcessInfo::Clean(pIVar7->mPPShared);
    pLVar6 = DefaultLogger::get();
    Logger::info(pLVar6,"Leaving post processing pipeline");
    std::unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
    ::~unique_ptr(&profiler);
    paVar8 = this->pimpl->mScene;
  }
  return paVar8;
}

Assistant:

const aiScene* Importer::ApplyPostProcessing(unsigned int pFlags) {
    ai_assert(nullptr != pimpl);
    
    ASSIMP_BEGIN_EXCEPTION_REGION();
    // Return immediately if no scene is active
    if (!pimpl->mScene) {
        return nullptr;
    }

    // If no flags are given, return the current scene with no further action
    if (!pFlags) {
        return pimpl->mScene;
    }

    // In debug builds: run basic flag validation
    ai_assert(_ValidateFlags(pFlags));
    ASSIMP_LOG_INFO("Entering post processing pipeline");

#ifndef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
    // The ValidateDS process plays an exceptional role. It isn't contained in the global
    // list of post-processing steps, so we need to call it manually.
    if (pFlags & aiProcess_ValidateDataStructure) {
        ValidateDSProcess ds;
        ds.ExecuteOnScene (this);
        if (!pimpl->mScene) {
            return nullptr;
        }
    }
#endif // no validation
#ifdef ASSIMP_BUILD_DEBUG
    if (pimpl->bExtraVerbose)
    {
#ifdef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
        ASSIMP_LOG_ERROR("Verbose Import is not available due to build settings");
#endif  // no validation
        pFlags |= aiProcess_ValidateDataStructure;
    }
#else
    if (pimpl->bExtraVerbose) {
        ASSIMP_LOG_WARN("Not a debug build, ignoring extra verbose setting");
    }
#endif // ! DEBUG

    std::unique_ptr<Profiler> profiler(GetPropertyInteger(AI_CONFIG_GLOB_MEASURE_TIME,0)?new Profiler():NULL);
    for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++)   {
        BaseProcess* process = pimpl->mPostProcessingSteps[a];
        pimpl->mProgressHandler->UpdatePostProcess(static_cast<int>(a), static_cast<int>(pimpl->mPostProcessingSteps.size()) );
        if( process->IsActive( pFlags)) {
            if (profiler) {
                profiler->BeginRegion("postprocess");
            }

            process->ExecuteOnScene ( this );

            if (profiler) {
                profiler->EndRegion("postprocess");
            }
        }
        if( !pimpl->mScene) {
            break;
        }
#ifdef ASSIMP_BUILD_DEBUG

#ifdef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
        continue;
#endif  // no validation

        // If the extra verbose mode is active, execute the ValidateDataStructureStep again - after each step
        if (pimpl->bExtraVerbose)   {
            ASSIMP_LOG_DEBUG("Verbose Import: re-validating data structures");

            ValidateDSProcess ds;
            ds.ExecuteOnScene (this);
            if( !pimpl->mScene) {
                ASSIMP_LOG_ERROR("Verbose Import: failed to re-validate data structures");
                break;
            }
        }
#endif // ! DEBUG
    }
    pimpl->mProgressHandler->UpdatePostProcess( static_cast<int>(pimpl->mPostProcessingSteps.size()), 
        static_cast<int>(pimpl->mPostProcessingSteps.size()) );

    // update private scene flags
    if( pimpl->mScene ) {
      ScenePriv(pimpl->mScene)->mPPStepsApplied |= pFlags;
    }

    // clear any data allocated by post-process steps
    pimpl->mPPShared->Clean();
    ASSIMP_LOG_INFO("Leaving post processing pipeline");

    ASSIMP_END_EXCEPTION_REGION(const aiScene*);
    
    return pimpl->mScene;
}